

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O0

Scale * __thiscall
icu_63::number::Scale::byDecimal(Scale *__return_storage_ptr__,Scale *this,StringPiece multiplicand)

{
  UBool UVar1;
  DecNum *pDVar2;
  StringPiece str;
  DecNum *local_60;
  LocalPointerBase<icu_63::number::impl::DecNum> local_30;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode localError;
  StringPiece multiplicand_local;
  
  str.length_ = multiplicand.ptr_._0_4_;
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_ = U_ZERO_ERROR;
  pDVar2 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)this);
  local_60 = (DecNum *)0x0;
  if (pDVar2 != (DecNum *)0x0) {
    impl::DecNum::DecNum(pDVar2);
    local_60 = pDVar2;
  }
  LocalPointer<icu_63::number::impl::DecNum>::LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_30,local_60,
             (UErrorCode *)
             ((long)&decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr + 4));
  UVar1 = ::U_FAILURE(decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::operator->(&local_30);
    str.ptr_ = (char *)this;
    str._12_4_ = 0;
    impl::DecNum::setTo(pDVar2,str,
                        (UErrorCode *)
                        ((long)&decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr + 4)
                       );
    UVar1 = ::U_FAILURE(decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
    if (UVar1 == '\0') {
      pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::orphan(&local_30);
      Scale(__return_storage_ptr__,0,pDVar2);
    }
    else {
      Scale(__return_storage_ptr__,
            decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
    }
  }
  else {
    Scale(__return_storage_ptr__,
          decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_);
  }
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDecimal(StringPiece multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}